

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O1

void __thiscall front::irGenerator::irGenerator::ir_leave_function(irGenerator *this)

{
  uint32_t uVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  *this_00;
  pointer pbVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  initializer_list<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string var;
  allocator_type local_f1;
  irGenerator *local_f0;
  undefined1 local_e8 [16];
  byte local_d8 [16];
  byte local_c8;
  JumpInstruction *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  string local_88;
  string local_68;
  vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  local_f0 = this;
  ir_label(this,this->_ReturnBlockLabelId);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
           ::operator[](&local_f0->_funcNameToFuncData,
                        (local_f0->_funcStack).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
  pbVar7 = (pmVar5->_freeList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pmVar5->_freeList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar2) {
    do {
      local_a8 = local_98;
      pcVar3 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar3,pcVar3 + pbVar7->_M_string_length);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"void","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"free","");
      local_e8._0_8_ = local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,local_a8,local_a0 + (long)local_a8);
      local_c8 = 2;
      __l._M_len = 1;
      __l._M_array = (iterator)local_e8;
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_48,__l,&local_f1);
      ir_function_call(local_f0,&local_88,VID,&local_68,&local_48,false);
      std::
      vector<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_48);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
        ::_S_vtable._M_arr[local_c8]._M_data)
                ((anon_class_1_0_00000001 *)&local_f1,
                 (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar2);
  }
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
           ::at(&(local_f0->_package).functions,
                (local_f0->_funcStack).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1);
  iVar4 = (*(((((pmVar6->type).
                super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ret)
              .super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Displayable)._vptr_Displayable[1])();
  if (iVar4 == 1) {
    local_e8._0_8_ = operator_new(0x38);
    (((JumpInstruction *)local_e8._0_8_)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001f0438;
    ((JumpInstruction *)local_e8._0_8_)->kind = Return;
    (((JumpInstruction *)local_e8._0_8_)->cond_or_ret).
    super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
    ((JumpInstruction *)local_e8._0_8_)->bb_true = -1;
    ((JumpInstruction *)local_e8._0_8_)->bb_false = -1;
    ((JumpInstruction *)local_e8._0_8_)->jump_kind = Undefined;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::JumpInstruction*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
               (JumpInstruction *)local_e8._0_8_);
  }
  else {
    local_b8 = (JumpInstruction *)0x0;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (iVar4 != 0) goto LAB_00188df9;
    local_e8._0_8_ = operator_new(0x38);
    uVar1 = local_f0->_ReturnVarId;
    (((JumpInstruction *)local_e8._0_8_)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001f0438;
    ((JumpInstruction *)local_e8._0_8_)->kind = Return;
    (((JumpInstruction *)local_e8._0_8_)->cond_or_ret).
    super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
    _vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    (((JumpInstruction *)local_e8._0_8_)->cond_or_ret).
    super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar1;
    (((JumpInstruction *)local_e8._0_8_)->cond_or_ret).
    super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
    ((JumpInstruction *)local_e8._0_8_)->bb_true = -1;
    ((JumpInstruction *)local_e8._0_8_)->bb_false = -1;
    ((JumpInstruction *)local_e8._0_8_)->jump_kind = Undefined;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<mir::inst::JumpInstruction*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
               (JumpInstruction *)local_e8._0_8_);
  }
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
  local_b8 = (JumpInstruction *)local_e8._0_8_;
  local_e8._0_8_ = (byte *)0x0;
  local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00188df9:
  p_Stack_b0 = this_01;
  this_00 = (vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
               ::operator[](&local_f0->_funcNameToInstructions,
                            (local_f0->_funcStack).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1);
  local_e8._0_8_ = local_b8;
  local_e8._8_8_ = p_Stack_b0;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_d8[0] = 1;
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>,std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>>
  ::
  emplace_back<std::variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>>
            (this_00,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                      *)local_e8);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_&>
    ::_S_vtable._M_arr[local_d8[0]]._M_data)
            ((anon_class_1_0_00000001 *)&local_a8,
             (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)local_e8);
  pbVar7 = (local_f0->_funcStack).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (local_f0->_funcStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar7 + -1;
  pcVar3 = pbVar7[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &pbVar7[-1].field_2) {
    operator_delete(pcVar3,pbVar7[-1].field_2._M_allocated_capacity + 1);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void irGenerator::ir_leave_function() {
  shared_ptr<mir::inst::JumpInstruction> jumpInst;

  ir_label(_ReturnBlockLabelId);

  for (string var : _funcNameToFuncData[_funcStack.back()]._freeList) {
    ir_function_call("void", symbol::SymbolKind::VID, "free", {var});
  }

  switch (_package.functions.at(_funcStack.back()).type->ret->kind()) {
    case mir::types::TyKind::Int: {
      jumpInst =
          shared_ptr<mir::inst::JumpInstruction>(new mir::inst::JumpInstruction(
              mir::inst::JumpInstructionKind::Return, -1, -1,
              VarId(_ReturnVarId), mir::inst::JumpKind::Undefined));
      break;
    }
    case mir::types::TyKind::Void: {
      jumpInst =
          shared_ptr<mir::inst::JumpInstruction>(new mir::inst::JumpInstruction(
              mir::inst::JumpInstructionKind::Return, -1, -1, std::nullopt,
              mir::inst::JumpKind::Undefined));
      break;
    }
    default:
      break;
  }
  _funcNameToInstructions[_funcStack.back()].push_back(jumpInst);
  _funcStack.pop_back();
}